

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppEmitter.cpp
# Opt level: O0

void __thiscall
Hpipe::CppEmitter::write_label(CppEmitter *this,StreamSepMaker *ss,uint num,char letter)

{
  StreamSep *pSVar1;
  bool bVar2;
  allocator local_1cb;
  byte local_1ca;
  byte local_1c9;
  string local_1c8;
  byte local_1a3;
  byte local_1a2;
  byte local_1a1;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  StreamSepMaker local_f0;
  StreamSep local_68;
  char local_1d;
  uint local_1c;
  char letter_local;
  StreamSepMaker *pSStack_18;
  uint num_local;
  StreamSepMaker *ss_local;
  CppEmitter *this_local;
  
  local_1d = letter;
  local_1c = num;
  pSStack_18 = ss;
  ss_local = (StreamSepMaker *)this;
  StreamSepMaker::rm_beg(&local_f0,ss,2);
  StreamSepMaker::operator<<(&local_68,&local_f0,&local_1d);
  pSVar1 = StreamSep::operator<<(&local_68,(char (*) [2])0x24bca6);
  pSVar1 = StreamSep::operator<<(pSVar1,&local_1c);
  pSVar1 = StreamSep::operator<<(pSVar1,(char (*) [2])0x2497fc);
  local_1a1 = 0;
  local_1a2 = 0;
  local_1a3 = 0;
  local_1c9 = 0;
  local_1ca = 0;
  bVar2 = (this->trace_labels & 1U) == 0;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_120,"",&local_1cb);
  }
  else {
    to_string<char>(&local_1a0,&local_1d);
    local_1a1 = 1;
    std::operator+(&local_180," std::cout << \"",&local_1a0);
    local_1a2 = 1;
    std::operator+(&local_160,&local_180,"_");
    local_1a3 = 1;
    to_string<unsigned_int>(&local_1c8,&local_1c);
    local_1c9 = 1;
    std::operator+(&local_140,&local_160,&local_1c8);
    local_1ca = 1;
    std::operator+(&local_120,&local_140,"\\t\" << __LINE__ << std::endl;");
  }
  StreamSep::operator<<(pSVar1,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  if (bVar2) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1cb);
  }
  if ((local_1ca & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_140);
  }
  if ((local_1c9 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  if ((local_1a3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_160);
  }
  if ((local_1a2 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_180);
  }
  if ((local_1a1 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_1a0);
  }
  StreamSep::~StreamSep(&local_68);
  StreamSepMaker::~StreamSepMaker(&local_f0);
  return;
}

Assistant:

void CppEmitter::write_label( StreamSepMaker &ss, unsigned num, char letter ) {
    ss.rm_beg( 2 ) << letter << "_" << num << ":" << ( trace_labels ? " std::cout << \"" + to_string( letter ) + "_" + to_string( num ) + "\\t\" << __LINE__ << std::endl;" : "" );
}